

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::ShortImplicationsGraph::Block::tryLock(Block *this,uint32 *size)

{
  uint uVar1;
  atomic_size *paVar2;
  bool bVar3;
  uint uStack_7c;
  uint32 s;
  uint32 *size_local;
  Block *this_local;
  
  paVar2 = &this->size_lock;
  uStack_7c = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  do {
    LOCK();
    uVar1 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
    bVar3 = uStack_7c == uVar1;
    if (bVar3) {
      (paVar2->super___atomic_base<unsigned_int>)._M_i = uStack_7c | 1;
      uVar1 = uStack_7c;
    }
    UNLOCK();
    uStack_7c = uVar1;
  } while (!bVar3);
  bVar3 = (uVar1 & 1) == 0;
  if (bVar3) {
    *size = uVar1 >> 1;
  }
  return bVar3;
}

Assistant:

bool ShortImplicationsGraph::Block::tryLock(uint32& size) {
	uint32 s = size_lock.fetch_or(1);
	if ((s & 1) == 0) {
		size = s >> 1;
		return true;
	}
	return false;
}